

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O2

void u_quadrature_rule(int n,double *t,double *w)

{
  ulong uVar1;
  double *e;
  long lVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    t[uVar1] = 0.0;
  }
  uVar1 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar1 = (ulong)(uint)n << 3;
  }
  e = (double *)operator_new__(uVar1);
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    e[uVar1] = 0.5;
  }
  *w = 1.2533141373155001;
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    w[lVar2] = 0.0;
  }
  imtqlx(n,t,e,w);
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    w[uVar1] = w[uVar1] * w[uVar1];
  }
  operator_delete__(e);
  return;
}

Assistant:

void u_quadrature_rule ( int n, double t[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    U_QUADRATURE_RULE: quadrature rule for U(n,x).
//
//  Discussion:
//
//    Thanks to Csaba Kertesz for pointing out some temporary memory that needed to be freed,
//    06 November 2015.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 November 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the rule.
//
//    Output, double T[N], W[N], the points and weights of the rule.
//
{
  double *bj;
  int i;
  const double r8_pi = 3.141592653589793;

  for ( i = 0; i < n; i++ )
  {
    t[i] = 0.0;
  }

  bj = new double[n];
  for ( i = 0; i < n; i++ )
  {
    bj[i] = 0.5;
  }

  w[0] = sqrt ( r8_pi / 2.0 );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
  imtqlx ( n, t, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }
//
//  Free memory.
//
  delete [] bj;

  return;
}